

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O0

void __thiscall
avro::detail::Chunk::Chunk(Chunk *this,data_type *data,size_type size,free_func *func)

{
  shared_ptr<avro::detail::CallOnDestroy> *in_RCX;
  long in_RDX;
  vtable_base *in_RSI;
  CallOnDestroy *in_RDI;
  CallOnDestroy *this_00;
  CallOnDestroy *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  operator_new(0x20);
  CallOnDestroy::CallOnDestroy(this_00,&in_RDI->func_);
  boost::shared_ptr<avro::detail::CallOnDestroy>::shared_ptr<avro::detail::CallOnDestroy>
            (in_RCX,in_stack_ffffffffffffffd8);
  boost::shared_array<char>::shared_array((shared_array<char> *)0x2aa0c3);
  this_00[1].func_.super_function0<void>.super_function_base.vtable = in_RSI;
  *(long *)&this_00[1].func_.super_function0<void>.super_function_base.functor =
       (long)&(this_00[1].func_.super_function0<void>.super_function_base.vtable)->manager + in_RDX;
  *(undefined8 *)((long)&this_00[1].func_.super_function0<void>.super_function_base.functor + 8) =
       *(undefined8 *)&this_00[1].func_.super_function0<void>.super_function_base.functor;
  return;
}

Assistant:

Chunk(const data_type *data, size_type size, const free_func &func) :
        callOnDestroy_(new CallOnDestroy(func)),
        readPos_(const_cast<data_type *>(data)),
        writePos_(readPos_ + size),
        endPos_(writePos_)
    { }